

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall
cppcms::application::render
          (application *this,string *skin,string *template_name,base_content *content)

{
  bool bVar1;
  manager *this_00;
  context *this_01;
  response *this_02;
  ostream *out;
  app_guard g;
  app_guard local_30;
  
  local_30.p_ = (base_content *)0x0;
  bVar1 = base_content::has_app(content);
  if (!bVar1) {
    local_30.p_ = content;
    base_content::app(content,this);
  }
  this_00 = cppcms::service::views_pool(((this->d).ptr_)->service);
  this_01 = context(this);
  this_02 = http::context::response(this_01);
  out = http::response::out(this_02);
  views::manager::render(this_00,skin,template_name,out,content);
  base_content::app_guard::~app_guard(&local_30);
  return;
}

Assistant:

void application::render(std::string skin,std::string template_name,base_content &content)
{
	base_content::app_guard g(content,*this);
	service().views_pool().render(skin,template_name,response().out(),content);
}